

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O2

string * __thiscall
duckdb_apache::thrift::
to_string<__gnu_cxx::__normal_iterator<duckdb_parquet::Encoding::type_const*,std::vector<duckdb_parquet::Encoding::type,std::allocator<duckdb_parquet::Encoding::type>>>>
          (string *__return_storage_ptr__,thrift *this,
          __normal_iterator<const_duckdb_parquet::Encoding::type_*,_std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>_>
          *beg,__normal_iterator<const_duckdb_parquet::Encoding::type_*,_std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>_>
               *end)

{
  type *extraout_RDX;
  type *val;
  type *extraout_RDX_00;
  type *extraout_RDX_01;
  duckdb_parquet *this_00;
  ostringstream o;
  string local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  val = extraout_RDX;
  for (this_00 = *(duckdb_parquet **)this; this_00 != (duckdb_parquet *)beg->_M_current;
      this_00 = this_00 + 4) {
    if (this_00 != *(duckdb_parquet **)this) {
      std::operator<<((ostream *)local_1a8,", ");
      val = extraout_RDX_00;
    }
    duckdb_parquet::to_string_abi_cxx11_(&local_1c8,this_00,val);
    std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    val = extraout_RDX_01;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const T& beg, const T& end) {
  std::ostringstream o;
  for (T it = beg; it != end; ++it) {
    if (it != beg)
      o << ", ";
    o << to_string(*it);
  }
  return o.str();
}